

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

bool __thiscall gl4cts::TextureViewTestViewSampling::executeTest(TextureViewTestViewSampling *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ulong uVar8;
  void *pvVar9;
  float *pfVar10;
  TestError *this_00;
  uchar *puVar11;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  bool bVar14;
  char local_89a;
  char local_899;
  MessageBuilder local_830;
  uchar *local_6b0;
  uchar *pixel_ptr;
  uchar *puStack_6a0;
  uint x;
  uchar *row_ptr;
  uint y;
  bool fs_result;
  MessageBuilder local_510;
  MessageBuilder local_390;
  MessageBuilder local_210;
  int local_90;
  int local_8c;
  int gs_result;
  int te_result;
  int tc_result;
  int vs_result;
  int *vertex_data_ptr;
  uint n_vertex;
  long local_68;
  int *bo_storage_ptr;
  Vec4 reference_color;
  uint n_sample;
  uint n_mipmap;
  float z;
  uint n_view_layer;
  uint n_view_face;
  uint n_texture_layer;
  uint n_texture_face;
  uint n_current_layer;
  bool is_view_cm_cma;
  float *reference_color_data;
  bool result;
  Functions *gl;
  TextureViewTestViewSampling *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  bVar3 = true;
  (**(code **)(lVar7 + 8))(0x84c0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1151);
  (**(code **)(lVar7 + 0xb8))(this->m_iteration_view_texture_target,this->m_view_to_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1154);
  (**(code **)(lVar7 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1158);
  (**(code **)(lVar7 + 0x1680))(this->m_po_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x115c);
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1161);
  (**(code **)(lVar7 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_result_to_id,0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glFramebufferTexture2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1164);
  auVar1 = ZEXT416(this->m_iteration_parent_texture_n_samples) * (undefined1  [16])0x10 * ZEXT816(4)
  ;
  uVar8 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  bVar14 = true;
  if (this->m_iteration_view_texture_target != 0x8513) {
    bVar14 = this->m_iteration_view_texture_target == 0x9009;
  }
  n_texture_layer = this->m_iteration_view_texture_minlayer;
  do {
    bVar2 = false;
    if (n_texture_layer <
        this->m_iteration_view_texture_minlayer + this->m_iteration_view_texture_numlayers) {
      bVar2 = bVar3;
    }
    if (!bVar2) {
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      return bVar3;
    }
    if (bVar14) {
      n_view_face = n_texture_layer % 6;
      n_view_layer = n_texture_layer / 6;
      z = (float)((n_texture_layer - this->m_iteration_view_texture_minlayer) % 6);
      n_mipmap = (n_texture_layer - this->m_iteration_view_texture_minlayer) / 6;
    }
    else {
      n_view_face = 0;
      n_view_layer = n_texture_layer;
      z = 0.0;
      n_mipmap = n_texture_layer;
    }
    if (this->m_po_z_float_location != -1) {
      n_sample = 0;
      if (((!bVar14) && (1 < this->m_iteration_view_texture_numlayers)) ||
         ((bVar14 && (6 < this->m_iteration_view_texture_numlayers)))) {
        if (bVar14) {
          n_sample = (uint)((float)n_mipmap /
                           (float)(this->m_iteration_view_texture_numlayers / 6 - 1));
        }
        else if (1 < this->m_iteration_view_texture_numlayers) {
          n_sample = (uint)((float)(n_mipmap - this->m_iteration_view_texture_minlayer) /
                           (float)(this->m_iteration_view_texture_numlayers - 1));
        }
      }
      (**(code **)(lVar7 + 0x14e0))(n_sample,this->m_po_z_float_location);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUniform1f() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11a9);
    }
    if (this->m_po_z_int_location != -1) {
      (**(code **)(lVar7 + 0x14f0))
                (this->m_po_z_int_location,n_texture_layer - this->m_iteration_view_texture_minlayer
                );
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUniform1i() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11b1);
    }
    if (this->m_po_n_face_location != -1) {
      (**(code **)(lVar7 + 0x14f0))(this->m_po_n_face_location,z);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUniform1i() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11b7);
    }
    reference_color.m_data[3] = (float)this->m_iteration_view_texture_minlevel;
    while( true ) {
      bVar2 = false;
      if ((uint)reference_color.m_data[3] <
          this->m_iteration_view_texture_minlevel + this->m_iteration_view_texture_numlevels) {
        bVar2 = bVar3;
      }
      if (bVar2 == false) break;
      if (this->m_po_lod_location != -1) {
        (**(code **)(lVar7 + 0x14e0))
                  ((float)((int)reference_color.m_data[3] - this->m_iteration_view_texture_minlevel)
                   ,this->m_po_lod_location);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glUniform1i() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x11c3);
      }
      for (reference_color.m_data[2] = 0.0;
          (uint)reference_color.m_data[2] < this->m_iteration_parent_texture_n_samples;
          reference_color.m_data[2] = (float)((int)reference_color.m_data[2] + 1)) {
        getReferenceColor((TextureViewTestViewSampling *)((long)&bo_storage_ptr + 4),(uint)this,
                          n_view_layer,n_view_face,(uint)reference_color.m_data[3]);
        pfVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)((long)&bo_storage_ptr + 4));
        *(float *)((long)pvVar9 + (ulong)(uint)((int)reference_color.m_data[2] << 2) * 4) = *pfVar10
        ;
        pfVar10 = tcu::Vector<float,_4>::y((Vector<float,_4> *)((long)&bo_storage_ptr + 4));
        *(float *)((long)pvVar9 + (ulong)((int)reference_color.m_data[2] * 4 + 1) * 4) = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)((long)&bo_storage_ptr + 4));
        *(float *)((long)pvVar9 + (ulong)((int)reference_color.m_data[2] * 4 + 2) * 4) = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::w((Vector<float,_4> *)((long)&bo_storage_ptr + 4));
        *(float *)((long)pvVar9 + (ulong)((int)reference_color.m_data[2] * 4 + 3) * 4) = *pfVar10;
      }
      (**(code **)(lVar7 + 0x15a8))
                (this->m_po_reference_colors_location,this->m_iteration_parent_texture_n_samples,
                 pvVar9);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUniform4fv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11d3);
      (**(code **)(lVar7 + 0xb8))(this->m_iteration_view_texture_target,this->m_view_to_id);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11d7);
      (**(code **)(lVar7 + 0x30))(4);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBeginTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11de);
      (**(code **)(lVar7 + 0x538))(0xe,0,1);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11e1);
      (**(code **)(lVar7 + 0x638))();
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glEndTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11e4);
      local_68 = (**(code **)(lVar7 + 0xcf8))(0x8c8e,35000);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glMapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x11ee);
      if (local_68 == 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"glMapBuffer() call succeeded but the pointer returned is NULL",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x11f1);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      vertex_data_ptr._0_4_ = 0;
      while( true ) {
        bVar2 = false;
        if ((uint)vertex_data_ptr < 6) {
          bVar2 = bVar3;
        }
        if (bVar2 == false) break;
        _tc_result = (int *)(local_68 + (ulong)((uint)vertex_data_ptr << 2) * 4);
        te_result = *_tc_result;
        gs_result = _tc_result[1];
        local_8c = _tc_result[2];
        local_90 = _tc_result[3];
        if (te_result != 1) {
          pTVar12 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_210,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar13 = tcu::MessageBuilder::operator<<
                              (&local_210,
                               (char (*) [49])"Invalid data was sampled in vertex shader stage.");
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_210);
          bVar3 = false;
        }
        if (gs_result != 1) {
          pTVar12 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_390,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar13 = tcu::MessageBuilder::operator<<
                              (&local_390,
                               (char (*) [63])
                               "Invalid data was sampled in tessellation control shader stage.");
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_390);
          bVar3 = false;
        }
        if (local_8c != 1) {
          pTVar12 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_510,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar13 = tcu::MessageBuilder::operator<<
                              (&local_510,
                               (char (*) [66])
                               "Invalid data was sampled in tessellation evaluation shader stage.");
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_510);
          bVar3 = false;
        }
        if (local_90 != 1) {
          pTVar12 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&y,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar13 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&y,
                               (char (*) [51])"Invalid data was sampled in geometry shader stage.");
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&y);
          bVar3 = false;
        }
        vertex_data_ptr._0_4_ = (uint)vertex_data_ptr + 1;
      }
      (**(code **)(lVar7 + 0x1670))(0x8c8e);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x122a);
      puVar11 = (uchar *)operator_new__((ulong)(this->m_reference_texture_width *
                                                this->m_reference_texture_height * 4));
      this->m_result_data = puVar11;
      (**(code **)(lVar7 + 0xb8))(0xde1,this->m_result_to_id);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindTexture() call failed for GL_TEXTURE_2D texture target.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1231);
      (**(code **)(lVar7 + 0xaa0))(0xde1,0,0x1908,0x1401,this->m_result_data);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glGetTexImage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1234);
      row_ptr._7_1_ = '\x01';
      row_ptr._0_4_ = 0;
      while( true ) {
        local_899 = '\0';
        if ((uint)row_ptr < this->m_reference_texture_height) {
          local_899 = row_ptr._7_1_;
        }
        if (local_899 == '\0') break;
        puStack_6a0 = this->m_result_data + this->m_reference_texture_width * (uint)row_ptr * 4;
        pixel_ptr._4_4_ = 0;
        while( true ) {
          local_89a = '\0';
          if (pixel_ptr._4_4_ < this->m_reference_texture_width) {
            local_89a = row_ptr._7_1_;
          }
          if (local_89a == '\0') break;
          local_6b0 = puStack_6a0 + (pixel_ptr._4_4_ << 2);
          if ((((*local_6b0 != 0xff) || (local_6b0[1] != 0xff)) || (local_6b0[2] != 0xff)) ||
             (local_6b0[3] != 0xff)) {
            pTVar12 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_830,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar13 = tcu::MessageBuilder::operator<<
                                (&local_830,(char (*) [30])"Invalid data was sampled at (");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)((long)&pixel_ptr + 4));
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x2a3caab);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)&row_ptr);
            pMVar13 = tcu::MessageBuilder::operator<<
                                (pMVar13,(char (*) [28])") in fragment shader stage.");
            tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_830);
            row_ptr._7_1_ = '\0';
          }
          pixel_ptr._4_4_ = pixel_ptr._4_4_ + 1;
        }
        row_ptr._0_4_ = (uint)row_ptr + 1;
      }
      if (row_ptr._7_1_ == '\0') {
        bVar3 = false;
      }
      if (this->m_result_data != (uchar *)0x0) {
        operator_delete__(this->m_result_data);
      }
      this->m_result_data = (uchar *)0x0;
      reference_color.m_data[3] = (float)((int)reference_color.m_data[3] + 1);
    }
    n_texture_layer = n_texture_layer + 1;
  } while( true );
}

Assistant:

bool TextureViewTestViewSampling::executeTest()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Bind the view to zero texture unit */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	gl.bindTexture(m_iteration_view_texture_target, m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* Bind the buffer object to zero TF binding point */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Activate the test program */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Update draw framebuffer configuration so that the test's fragment shader draws
	 * to the result texture */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_result_to_id, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Allocate enough space to hold reference color data for all sample s*/
	float* reference_color_data = new float[m_iteration_parent_texture_n_samples * sizeof(float) * 4 /* rgba */];

	/* Iterate through the layer/face/mipmap hierarchy. For each iteration, we
	 * potentially need to update relevant uniforms controlling the sampling process
	 * the test program object performs.
	 */
	bool is_view_cm_cma = (m_iteration_view_texture_target == GL_TEXTURE_CUBE_MAP ||
						   m_iteration_view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

	for (unsigned int n_current_layer = m_iteration_view_texture_minlayer;
		 n_current_layer < (m_iteration_view_texture_minlayer + m_iteration_view_texture_numlayers) && result;
		 n_current_layer++)
	{
		unsigned int n_texture_face  = 0;
		unsigned int n_texture_layer = 0;
		unsigned int n_view_face	 = 0;
		unsigned int n_view_layer	= 0;

		if (is_view_cm_cma)
		{
			n_texture_face  = n_current_layer % 6;										 /* faces */
			n_texture_layer = n_current_layer / 6;										 /* faces */
			n_view_face		= (n_current_layer - m_iteration_view_texture_minlayer) % 6; /* faces */
			n_view_layer	= (n_current_layer - m_iteration_view_texture_minlayer) / 6; /* faces */
		}
		else
		{
			/* Only cube-map and cube-map array textures consist of faces. */
			n_texture_face  = 0;
			n_texture_layer = n_current_layer;
			n_view_face		= 0;
			n_view_layer	= n_current_layer;
		}

		if (m_po_z_float_location != -1)
		{
			float z = 0.0f;

			if (((false == is_view_cm_cma) && (m_iteration_view_texture_numlayers > 1)) ||
				((true == is_view_cm_cma) && (m_iteration_view_texture_numlayers > 6)))
			{
				if (is_view_cm_cma)
				{
					z = float(n_view_layer) / float(m_iteration_view_texture_numlayers / 6 - 1);
				}
				else
				{
					if (m_iteration_view_texture_numlayers > 1)
					{
						/* The program will be sampling a view so make sure that layer the shader accesses
						 * is relative to how our view was configured */
						z = float(n_view_layer - m_iteration_view_texture_minlayer) /
							float(m_iteration_view_texture_numlayers - 1);
					}
					else
					{
						/* z should stay at 0 */
					}
				}
			}
			else
			{
				/* z should stay at 0.0 */
			}

			gl.uniform1f(m_po_z_float_location, z);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");
		}

		if (m_po_z_int_location != -1)
		{
			DE_ASSERT(!is_view_cm_cma);

			gl.uniform1i(m_po_z_int_location, n_current_layer - m_iteration_view_texture_minlayer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
		}

		if (m_po_n_face_location != -1)
		{
			gl.uniform1i(m_po_n_face_location, n_view_face);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
		}

		for (unsigned int n_mipmap = m_iteration_view_texture_minlevel;
			 n_mipmap < (m_iteration_view_texture_minlevel + m_iteration_view_texture_numlevels) && result; n_mipmap++)
		{
			if (m_po_lod_location != -1)
			{
				/* The program will be sampling a view so make sure that LOD the shader accesses
				 * is relative to how our view was configured.
				 */
				gl.uniform1f(m_po_lod_location, (float)(n_mipmap - m_iteration_view_texture_minlevel));
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");
			}

			/* Update local reference color data storage */
			for (unsigned int n_sample = 0; n_sample < m_iteration_parent_texture_n_samples; ++n_sample)
			{
				tcu::Vec4 reference_color = getReferenceColor(n_texture_layer, n_texture_face, n_mipmap, n_sample);

				reference_color_data[4 /* rgba */ * n_sample + 0] = reference_color.x();
				reference_color_data[4 /* rgba */ * n_sample + 1] = reference_color.y();
				reference_color_data[4 /* rgba */ * n_sample + 2] = reference_color.z();
				reference_color_data[4 /* rgba */ * n_sample + 3] = reference_color.w();
			}

			/* Upload it to GPU */
			gl.uniform4fv(m_po_reference_colors_location, m_iteration_parent_texture_n_samples, reference_color_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

			/* Bind the texture view to sample from */
			gl.bindTexture(m_iteration_view_texture_target, m_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			/* Draw a single patch. Given the rendering pipeline we've defined in the
			 * test program object, this should give us a nice full-screen quad, as well
			 * as 6*4 ints XFBed out, describing whether the view was sampled correctly.
			 */
			gl.beginTransformFeedback(GL_TRIANGLES);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
			{
				gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
			}
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

			/* In order to verify if the texel data was sampled correctly, we need to do two things:
			 *
			 * 1) Verify buffer object contents;
			 * 2) Make sure that all texels of current render-target are vec4(1).
			 *
			 */
			const int* bo_storage_ptr = (const int*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");
			if (bo_storage_ptr == NULL)
			{
				TCU_FAIL("glMapBuffer() call succeeded but the pointer returned is NULL");
			}

			/* The rendering pipeline should have written 6 vertices * 4 ints to the BO.
			 * The integers are set to 1 if the sampled texels were found valid, 0 otherwise,
			 * and are arranged in the following order:
			 *
			 * 1) Result of sampling in vertex shader stage;
			 * 2) Result of sampling in tessellation control shader stage;
			 * 3) Result of sampling in tessellation evaluation shader stage;
			 * 4) Result of sampling in geometry shader stage;
			 */
			for (unsigned int n_vertex = 0; n_vertex < 6 /* as per comment */ && result; ++n_vertex)
			{
				const int* vertex_data_ptr = bo_storage_ptr + n_vertex * 4 /* as per comment */;
				int		   vs_result	   = vertex_data_ptr[0];
				int		   tc_result	   = vertex_data_ptr[1];
				int		   te_result	   = vertex_data_ptr[2];
				int		   gs_result	   = vertex_data_ptr[3];

				if (vs_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled in vertex shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (tc_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid data was sampled in tessellation control shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (te_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid data was sampled in tessellation evaluation shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}

				if (gs_result != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled in geometry shader stage."
									   << tcu::TestLog::EndMessage;

					result = false;
				}
			} /* for (all vertices) */

			/* Unmap the BO */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Read texels rendered by the fragment shader. The texture attached uses
			 * GL_RGBA8 internalformat.*/
			m_result_data = new unsigned char[m_reference_texture_width * m_reference_texture_height * 4 /* RGBA */];

			gl.bindTexture(GL_TEXTURE_2D, m_result_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed for GL_TEXTURE_2D texture target.");

			gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, GL_RGBA, GL_UNSIGNED_BYTE, m_result_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			/* The test fails if any of the fragments is not equal to vec4(1) */
			bool fs_result = true;

			for (unsigned int y = 0; y < m_reference_texture_height && fs_result; ++y)
			{
				const unsigned char* row_ptr = m_result_data + m_reference_texture_width * y * 4 /* RGBA */;

				for (unsigned int x = 0; x < m_reference_texture_width && fs_result; ++x)
				{
					const unsigned char* pixel_ptr = row_ptr + x * 4 /* RGBA */;

					if (pixel_ptr[0] != 255 || pixel_ptr[1] != 255 || pixel_ptr[2] != 255 || pixel_ptr[3] != 255)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled at (" << x << ", " << y
										   << ") "
											  "in fragment shader stage."
										   << tcu::TestLog::EndMessage;

						fs_result = false;
					}
				} /* for (all columns) */
			}	 /* for (all rows) */

			if (!fs_result)
			{
				result = false;
			}

			/* Done - we can release the buffer at this point */
			delete[] m_result_data;
			m_result_data = DE_NULL;
		} /* for (all mip-maps) */
	}	 /* for (all texture layers) */

	/* Release the reference color data buffer */
	delete[] reference_color_data;
	reference_color_data = DE_NULL;

	/* All done */
	return result;
}